

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_abs>(Mat *a,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  unary_op_abs *this;
  long *in_RDI;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_abs op;
  Mat *m;
  float *in_stack_fffffffffffffc80;
  unary_op_abs *in_stack_fffffffffffffc88;
  unary_op_abs *in_stack_fffffffffffffc90;
  __m512 *x;
  float local_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  int local_290;
  float local_280 [8];
  long local_260;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  undefined8 local_240;
  unary_op_abs *local_238;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  unary_op_abs local_211 [9];
  long *local_208;
  undefined1 local_1fd;
  int local_1fc;
  float *local_1f0;
  float *local_1e8;
  __m512 *local_1d8;
  unary_op_abs *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  unary_op_abs *local_150;
  unary_op_abs *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  unary_op_abs *local_110;
  unary_op_abs *local_108;
  float local_100 [2];
  float afStack_f8 [4];
  unary_op_abs *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  unary_op_abs *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  float *local_b0;
  undefined4 local_a4;
  long local_a0;
  __m512 *local_80;
  
  local_218 = *(int *)((long)in_RDI + 0x2c);
  local_21c = (int)in_RDI[6];
  local_220 = *(int *)((long)in_RDI + 0x34);
  local_224 = (int)in_RDI[7];
  local_228 = (int)in_RDI[3];
  local_22c = local_218 * local_21c * local_220 * local_228;
  local_208 = in_RDI;
  for (local_230 = 0; local_230 < local_224; local_230 = local_230 + 1) {
    local_1f0 = local_280;
    local_b4 = *(int *)((long)local_208 + 0x2c);
    local_b8 = (int)local_208[6];
    local_bc = *(undefined4 *)((long)local_208 + 0x34);
    this = (unary_op_abs *)(*local_208 + local_208[8] * (long)local_230 * local_208[2]);
    local_d0 = local_208[2];
    local_d4 = (undefined4)local_208[3];
    local_e0 = local_208[4];
    local_b0 = local_280;
    local_a0 = (long)local_b4 * (long)local_b8 * local_d0;
    local_1e8 = local_280;
    x = (__m512 *)local_280;
    local_a4 = 0x10;
    local_1fc = local_230;
    local_1fd = 1;
    local_280[0] = 0.0;
    local_280[1] = 0.0;
    local_280[4] = 0.0;
    local_280[5] = 0.0;
    local_280[6] = 0.0;
    local_258 = 0.0;
    local_254 = 0.0;
    local_250 = 0.0;
    local_24c = 0.0;
    local_248 = 0.0;
    local_240 = 0;
    local_280[2] = 0.0;
    local_280[3] = 0.0;
    local_238 = this;
    local_1d8 = x;
    local_c8 = this;
    local_80 = x;
    local_260 = local_e0;
    for (local_290 = 0; local_290 + 0xf < local_22c; local_290 = local_290 + 0x10) {
      local_1c8 = local_238;
      uVar6 = *(undefined8 *)local_238;
      uVar5 = *(undefined8 *)(local_238 + 8);
      uVar7 = *(undefined8 *)(local_238 + 0x10);
      uVar8 = *(undefined8 *)(local_238 + 0x18);
      uVar9 = *(undefined8 *)(local_238 + 0x20);
      uVar10 = *(undefined8 *)(local_238 + 0x28);
      uVar11 = *(undefined8 *)(local_238 + 0x30);
      uVar12 = *(undefined8 *)(local_238 + 0x38);
      local_300 = uVar6;
      uStack_2f8 = uVar5;
      uStack_2f0 = uVar7;
      uStack_2e8 = uVar8;
      uStack_2e0 = uVar9;
      uStack_2d8 = uVar10;
      uStack_2d0 = uVar11;
      uStack_2c8 = uVar12;
      UnaryOp_x86_avx512_functor::unary_op_abs::func_pack16(this,x);
      local_150 = local_238;
      auVar1._8_8_ = uVar5;
      auVar1._0_8_ = uVar6;
      auVar1._16_8_ = uVar7;
      auVar1._24_8_ = uVar8;
      auVar1._32_8_ = uVar9;
      auVar1._40_8_ = uVar10;
      auVar1._48_8_ = uVar11;
      auVar1._56_8_ = uVar12;
      *(undefined1 (*) [64])local_238 = auVar1;
      local_238 = local_238 + 0x40;
      local_300 = uVar6;
      uStack_2f8 = uVar5;
      uStack_2f0 = uVar7;
      uStack_2e8 = uVar8;
      uStack_2e0 = uVar9;
      uStack_2d8 = uVar10;
      uStack_2d0 = uVar11;
      uStack_2c8 = uVar12;
      local_1c0 = uVar6;
      uStack_1b8 = uVar5;
      uStack_1b0 = uVar7;
      uStack_1a8 = uVar8;
      uStack_1a0 = uVar9;
      uStack_198 = uVar10;
      uStack_190 = uVar11;
      uStack_188 = uVar12;
    }
    for (; local_290 + 7 < local_22c; local_290 = local_290 + 8) {
      local_148 = local_238;
      uVar6 = *(undefined8 *)local_238;
      uVar5 = *(undefined8 *)(local_238 + 8);
      uVar7 = *(undefined8 *)(local_238 + 0x10);
      uVar8 = *(undefined8 *)(local_238 + 0x18);
      local_320 = uVar6;
      uStack_318 = uVar5;
      uStack_310 = uVar7;
      uStack_308 = uVar8;
      UnaryOp_x86_avx512_functor::unary_op_abs::func_pack8
                (in_stack_fffffffffffffc90,(__m256 *)in_stack_fffffffffffffc88);
      local_110 = local_238;
      auVar2._8_8_ = uVar5;
      auVar2._0_8_ = uVar6;
      auVar2._16_8_ = uVar7;
      auVar2._24_8_ = uVar8;
      *(undefined1 (*) [32])local_238 = auVar2;
      local_238 = local_238 + 0x20;
      local_320 = uVar6;
      uStack_318 = uVar5;
      uStack_310 = uVar7;
      uStack_308 = uVar8;
      local_140 = uVar6;
      uStack_138 = uVar5;
      uStack_130 = uVar7;
      uStack_128 = uVar8;
    }
    for (; local_290 + 3 < local_22c; local_290 = local_290 + 4) {
      local_108 = local_238;
      local_330 = *(float (*) [2])local_238;
      uVar6 = *(undefined8 *)(local_238 + 8);
      afStack_328 = (float  [2])uVar6;
      afVar13 = UnaryOp_x86_avx512_functor::unary_op_abs::func_pack4(local_211,(__m128 *)local_330);
      local_330 = afVar13._0_8_;
      local_e8 = local_238;
      auVar3._8_4_ = (float)uVar6;
      auVar3._12_4_ = SUB84(uVar6,4);
      auVar3._0_4_ = local_330[0];
      auVar3._4_4_ = local_330[1];
      *(undefined1 (*) [16])local_238 = auVar3;
      local_238 = local_238 + 0x10;
      afStack_328 = (float  [2])uVar6;
      local_100 = local_330;
      afStack_f8._0_8_ = uVar6;
    }
    for (; local_290 < local_22c; local_290 = local_290 + 1) {
      fVar4 = UnaryOp_x86_avx512_functor::unary_op_abs::func
                        (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      *(float *)local_238 = fVar4;
      local_238 = local_238 + 4;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}